

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::InstanceSymbol::InstanceSymbol
          (InstanceSymbol *this,Compilation *compilation,string_view name,SourceLocation loc,
          Definition *definition,ParameterBuilder *paramBuilder,bool isUninstantiated)

{
  InstanceBodySymbol *body;
  bool isUninstantiated_local;
  Definition *definition_local;
  Compilation *compilation_local;
  InstanceSymbol *this_local;
  SourceLocation loc_local;
  string_view name_local;
  
  body = InstanceBodySymbol::fromDefinition
                   (compilation,definition,loc,paramBuilder,isUninstantiated);
  InstanceSymbol(this,name,loc,body);
  return;
}

Assistant:

InstanceSymbol::InstanceSymbol(Compilation& compilation, string_view name, SourceLocation loc,
                               const Definition& definition, ParameterBuilder& paramBuilder,
                               bool isUninstantiated) :
    InstanceSymbol(name, loc,
                   InstanceBodySymbol::fromDefinition(compilation, definition, loc, paramBuilder,
                                                      isUninstantiated)) {
}